

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

OwnPromiseNode kj::_::readyNow(void)

{
  int iVar1;
  PromiseNode *in_RDI;
  
  if (readyNow()::NODE == '\0') {
    iVar1 = __cxa_guard_acquire(&readyNow()::NODE);
    if (iVar1 != 0) {
      readyNow::ReadyNowPromiseNode::ReadyNowPromiseNode(&readyNow::NODE);
      __cxa_atexit(readyNow::ReadyNowPromiseNode::~ReadyNowPromiseNode,&readyNow::NODE,&__dso_handle
                  );
      __cxa_guard_release(&readyNow()::NODE);
    }
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::Own
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)in_RDI,
             (PromiseNode *)&readyNow::NODE);
  return (OwnPromiseNode)in_RDI;
}

Assistant:

OwnPromiseNode readyNow() {
  class ReadyNowPromiseNode: public ImmediatePromiseNodeBase {
    // This is like `ConstPromiseNode<Void, Void{}>`, but the compiler won't let me pass a literal
    // value of type `Void` as a template parameter. (Might require C++20?)

  public:
    void destroy() override {}
    void get(ExceptionOrValue& output) noexcept override {
      output.as<Void>() = Void();
    }
  };

  static ReadyNowPromiseNode NODE;
  return OwnPromiseNode(&NODE);
}